

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_escaped_cp<fmt::v9::appender,char>
                   (appender out,find_escape_result<char> *escape)

{
  uint32_t uVar1;
  char *s;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> *pbVar2;
  appender aVar3;
  type count;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_c0;
  find_escape_result<char> *local_b8;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_b0;
  byte local_a1;
  iterator pcStack_a0;
  char escape_char;
  iterator __end0;
  iterator __begin0;
  basic_string_view<char> *local_80;
  basic_string_view<char> *__range4;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_70;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_68;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_60;
  value_type_conflict1 local_51;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_50;
  value_type_conflict1 local_41;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_40;
  value_type_conflict1 local_31;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_30;
  value_type_conflict1 local_22;
  value_type_conflict1 local_21;
  find_escape_result<char> *pfStack_20;
  char c;
  find_escape_result<char> *escape_local;
  appender out_local;
  
  local_21 = (value_type_conflict1)escape->cp;
  uVar1 = escape->cp;
  pfStack_20 = escape;
  escape_local = (find_escape_result<char> *)
                 out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  if (uVar1 == 9) {
    local_41 = '\\';
    local_50.container = (buffer<char> *)appender::operator++((appender *)&escape_local,0);
    pbVar2 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_50);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar2,&local_41);
    local_21 = 't';
  }
  else if (uVar1 == 10) {
    local_22 = '\\';
    local_30.container = (buffer<char> *)appender::operator++((appender *)&escape_local,0);
    pbVar2 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_30);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar2,&local_22);
    local_21 = 'n';
  }
  else if (uVar1 == 0xd) {
    local_31 = '\\';
    local_40.container = (buffer<char> *)appender::operator++((appender *)&escape_local,0);
    pbVar2 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_40);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar2,&local_31);
    local_21 = 'r';
  }
  else {
    if (((uVar1 != 0x22) && (uVar1 != 0x27)) && (uVar1 != 0x5c)) {
      if (escape->cp < 0x100) {
        local_68 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
        aVar3 = write_codepoint<2ul,char,fmt::v9::appender>(out,'x',escape->cp);
        return (appender)
               aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if (escape->cp < 0x10000) {
        local_70 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
        aVar3 = write_codepoint<4ul,char,fmt::v9::appender>(out,'u',escape->cp);
        return (appender)
               aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      if (escape->cp < 0x110000) {
        __range4 = (basic_string_view<char> *)
                   out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
        aVar3 = write_codepoint<8ul,char,fmt::v9::appender>(out,'U',escape->cp);
        return (appender)
               aVar3.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      s = escape->begin;
      count = to_unsigned<long>((long)escape->end - (long)escape->begin);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)&__begin0,s,count);
      local_80 = (basic_string_view<char> *)&__begin0;
      __end0 = basic_string_view<char>::begin(local_80);
      pcStack_a0 = basic_string_view<char>::end(local_80);
      for (; __end0 != pcStack_a0; __end0 = __end0 + 1) {
        local_a1 = *__end0;
        local_b8 = escape_local;
        local_b0.container =
             (buffer<char> *)
             write_codepoint<2ul,char,fmt::v9::appender>((appender)escape_local,'x',(uint)local_a1);
        escape_local = (find_escape_result<char> *)local_b0.container;
      }
      return ((appender)(appender)escape_local).
             super_back_insert_iterator<fmt::v9::detail::buffer<char>_>;
    }
    local_51 = '\\';
    local_60.container = (buffer<char> *)appender::operator++((appender *)&escape_local,0);
    pbVar2 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_60);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar2,&local_51);
  }
  local_c0.container = (buffer<char> *)appender::operator++((appender *)&escape_local,0);
  pbVar2 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_c0);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar2,&local_21);
  return ((appender)(appender)escape_local).
         super_back_insert_iterator<fmt::v9::detail::buffer<char>_>;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (is_utf8()) {
      if (escape.cp < 0x100) {
        return write_codepoint<2, Char>(out, 'x', escape.cp);
      }
      if (escape.cp < 0x10000) {
        return write_codepoint<4, Char>(out, 'u', escape.cp);
      }
      if (escape.cp < 0x110000) {
        return write_codepoint<8, Char>(out, 'U', escape.cp);
      }
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}